

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_GetTestFileAndLineFromFailure_Test::testBody
          (TEST_TestFailure_GetTestFileAndLineFromFailure_Test *this)

{
  undefined *puVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  size_t sVar5;
  undefined1 local_a8 [56];
  TestFailure f1;
  TEST_TestFailure_GetTestFileAndLineFromFailure_Test *this_local;
  
  puVar1 = (anonymous_namespace)::failFileName;
  pUVar2 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f1.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"the failure message");
  TestFailure::TestFailure
            ((TestFailure *)(local_a8 + 0x30),pUVar2,puVar1,2,(SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar2 = UtestShell::getCurrent();
  puVar1 = (anonymous_namespace)::failFileName;
  TestFailure::getTestFileName((TestFailure *)local_a8);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,puVar1,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x3e,pTVar4);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  pUVar2 = UtestShell::getCurrent();
  sVar5 = TestFailure::getTestLineNumber((TestFailure *)(local_a8 + 0x30));
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar5,"LONGS_EQUAL(1, f1.getTestLineNumber()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x3f,pTVar4);
  TestFailure::~TestFailure((TestFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, GetTestFileAndLineFromFailure)
{
    TestFailure f1(test, failFileName, failLineNumber, "the failure message");
    STRCMP_EQUAL(failFileName, f1.getTestFileName().asCharString());
    LONGS_EQUAL(1, f1.getTestLineNumber());
}